

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O0

int ini_section_add(ini_t *ini,char *name,int length)

{
  ini_internal_section_t *__dest;
  char *pcVar1;
  ini_internal_section_t *new_sections;
  int length_local;
  char *name_local;
  ini_t *ini_local;
  
  if ((ini == (ini_t *)0x0) || (name == (char *)0x0)) {
    ini_local._4_4_ = -1;
  }
  else {
    new_sections._4_4_ = length;
    if (length < 1) {
      new_sections._4_4_ = sx_strlen(name);
    }
    if (ini->section_capacity <= ini->section_count) {
      ini->section_capacity = ini->section_capacity << 1;
      __dest = (ini_internal_section_t *)
               sx__malloc((sx_alloc *)ini->memctx,(long)ini->section_capacity * 0x28,0,(char *)0x0,
                          (char *)0x0,0);
      memcpy(__dest,ini->sections,(long)ini->section_count * 0x28);
      sx__free((sx_alloc *)ini->memctx,ini->sections,0,(char *)0x0,(char *)0x0,0);
      ini->sections = __dest;
    }
    ini->sections[ini->section_count].name_large = (char *)0x0;
    if (new_sections._4_4_ + 1U < 0x20) {
      memcpy(ini->sections + ini->section_count,name,(long)new_sections._4_4_);
      ini->sections[ini->section_count].name[new_sections._4_4_] = '\0';
    }
    else {
      pcVar1 = (char *)sx__malloc((sx_alloc *)ini->memctx,(long)new_sections._4_4_ + 1,0,(char *)0x0
                                  ,(char *)0x0,0);
      ini->sections[ini->section_count].name_large = pcVar1;
      memcpy(ini->sections[ini->section_count].name_large,name,(long)new_sections._4_4_);
      ini->sections[ini->section_count].name_large[new_sections._4_4_] = '\0';
    }
    ini_local._4_4_ = ini->section_count;
    ini->section_count = ini_local._4_4_ + 1;
  }
  return ini_local._4_4_;
}

Assistant:

int ini_section_add( ini_t* ini, char const* name, int length )
    {
    struct ini_internal_section_t* new_sections;
    
    if( ini && name )
        {
        if( length <= 0 ) length = (int) INI_STRLEN( name );
        if( ini->section_count >= ini->section_capacity )
            {
            ini->section_capacity *= 2;
            new_sections = (struct ini_internal_section_t*) INI_MALLOC( ini->memctx, 
                ini->section_capacity * sizeof( ini->sections[ 0 ] ) );
            INI_MEMCPY( new_sections, ini->sections, ini->section_count * sizeof( ini->sections[ 0 ] ) );
            INI_FREE( ini->memctx, ini->sections );
            ini->sections = new_sections;
            }

        ini->sections[ ini->section_count ].name_large = 0;
        if( length + 1 >= sizeof( ini->sections[ 0 ].name ) )
            {
            ini->sections[ ini->section_count ].name_large = (char*) INI_MALLOC( ini->memctx, (size_t) length + 1 );
            INI_MEMCPY( ini->sections[ ini->section_count ].name_large, name, (size_t) length );
            ini->sections[ ini->section_count ].name_large[ length ] = '\0';
            }
        else
            {
            INI_MEMCPY( ini->sections[ ini->section_count ].name, name, (size_t) length );
            ini->sections[ ini->section_count ].name[ length ] = '\0';
            }

        return ini->section_count++;
        }
    return INI_NOT_FOUND;
    }